

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweeper_kba_c_kernels.h
# Opt level: O0

void Sweeper_sweep_block_impl
               (SweeperLite sweeper,P *vo,P *vi,P *facexy,P *facexz,P *faceyz,P *a_from_m,
               P *m_from_a,int step,Quantities quan,Bool_t proc_x_min,Bool_t proc_x_max,
               Bool_t proc_y_min,Bool_t proc_y_max,StepInfoAll stepinfoall,
               unsigned_long do_block_init)

{
  StepInfo stepinfo_00;
  SweeperLite SVar1;
  int nsemiblock_00;
  int iVar2;
  int iVar3;
  int iVar4;
  P *vi_this_00;
  P *vo_this_00;
  int do_block_init_this;
  P *vo_this;
  P *vi_this;
  int iz_base;
  int izmax_semiblock_up2;
  int izmax_semiblock;
  int izmin_semiblock;
  Bool_t is_semiblock_max_z;
  Bool_t is_semiblock_min_z;
  int iymax_semiblock_up2;
  int iymax_semiblock;
  int iymin_semiblock;
  Bool_t is_semiblock_max_y;
  Bool_t is_semiblock_min_y;
  int ixmax_semiblock_up2;
  int ixmax_semiblock;
  int ixmin_semiblock;
  Bool_t is_semiblock_max_x;
  Bool_t is_semiblock_min_x;
  int dir_z;
  int dir_y;
  int dir_x;
  Bool_t is_octant_active;
  StepInfo stepinfo;
  int octant_in_block;
  int octant_in_block_max;
  int octant_in_block_min;
  int semiblock_step;
  int nsemiblock;
  int noctant_per_block;
  P *a_from_m_local;
  P *faceyz_local;
  P *facexz_local;
  P *facexy_local;
  P *vi_local;
  P *vo_local;
  
  SVar1 = sweeper;
  nsemiblock_00 = sweeper.nsemiblock;
  for (octant_in_block_max = 0; iVar3 = sweeper.noctant_per_block,
      octant_in_block_max < nsemiblock_00; octant_in_block_max = octant_in_block_max + 1) {
    iVar2 = Sweeper_thread_octant(&sweeper);
    iVar4 = sweeper.noctant_per_block;
    iVar3 = (iVar3 * iVar2) / sweeper.nthread_octant;
    iVar2 = Sweeper_thread_octant(&sweeper);
    iVar4 = (iVar4 * (iVar2 + 1)) / sweeper.nthread_octant;
    for (stepinfo.is_active = iVar3; stepinfo.is_active < iVar4;
        stepinfo.is_active = stepinfo.is_active + 1) {
      dir_x = stepinfoall.stepinfo[stepinfo.is_active].block_z;
      is_octant_active = stepinfoall.stepinfo[stepinfo.is_active].octant;
      dir_y = stepinfoall.stepinfo[stepinfo.is_active].is_active;
      stepinfo.block_z = dir_y;
      dir_z = Dir_x(is_octant_active);
      is_semiblock_min_x = Dir_y(is_octant_active);
      is_semiblock_max_x = Dir_z(is_octant_active);
      ixmin_semiblock = 0;
      ixmax_semiblock = 0;
      ixmax_semiblock_up2 = 0;
      is_semiblock_min_y = 0;
      is_semiblock_max_y = 0;
      Sweeper_get_semiblock_bounds
                (&ixmin_semiblock,&ixmax_semiblock,&ixmax_semiblock_up2,&is_semiblock_min_y,
                 &is_semiblock_max_y,sweeper.dims_b.ncell_x,0,dir_z,octant_in_block_max,
                 nsemiblock_00);
      iymin_semiblock = 0;
      iymax_semiblock = 0;
      iymax_semiblock_up2 = 0;
      is_semiblock_min_z = 0;
      is_semiblock_max_z = 0;
      Sweeper_get_semiblock_bounds
                (&iymin_semiblock,&iymax_semiblock,&iymax_semiblock_up2,&is_semiblock_min_z,
                 &is_semiblock_max_z,sweeper.dims_b.ncell_y,1,is_semiblock_min_x,octant_in_block_max
                 ,nsemiblock_00);
      izmin_semiblock = 0;
      izmax_semiblock = 0;
      izmax_semiblock_up2 = 0;
      iz_base = 0;
      vi_this._4_4_ = 0;
      Sweeper_get_semiblock_bounds
                (&izmin_semiblock,&izmax_semiblock,&izmax_semiblock_up2,&iz_base,
                 (int *)((long)&vi_this + 4),sweeper.dims_b.ncell_z,2,is_semiblock_max_x,
                 octant_in_block_max,nsemiblock_00);
      vi_this._0_4_ = dir_x * sweeper.dims_b.ncell_z;
      vi_this_00 = const_ref_state(vi,sweeper.dims,4,0,0,(int)vi_this,0,0,0);
      vo_this_00 = ref_state(vo,sweeper.dims,4,0,0,(int)vi_this,0,0,0);
      stepinfo_00.is_active = stepinfo.block_z;
      stepinfo_00.block_z = dir_x;
      stepinfo_00.octant = is_octant_active;
      Sweeper_sweep_semiblock
                (&sweeper,vo_this_00,vi_this_00,facexy,facexz,faceyz,a_from_m,m_from_a,&quan,
                 stepinfo_00,stepinfo.is_active,ixmax_semiblock_up2,is_semiblock_max_y,
                 iymax_semiblock_up2,is_semiblock_max_z,izmax_semiblock_up2,vi_this._4_4_,
                 (uint)((do_block_init &
                        1L << ((char)stepinfo.is_active +
                               (char)SVar1.noctant_per_block * (char)octant_in_block_max & 0x3fU))
                       != 0),dir_y);
    }
    Sweeper_sync_octant_threads(&sweeper);
  }
  return;
}

Assistant:

TARGET_HD void Sweeper_sweep_block_impl(
  SweeperLite            sweeper,
        P* __restrict__  vo,
  const P* __restrict__  vi,
        P* __restrict__  facexy,
        P* __restrict__  facexz,
        P* __restrict__  faceyz,
  const P* __restrict__  a_from_m,
  const P* __restrict__  m_from_a,
  int                    step,
  const Quantities       quan,
  Bool_t                 proc_x_min,
  Bool_t                 proc_x_max,
  Bool_t                 proc_y_min,
  Bool_t                 proc_y_max,
  StepInfoAll            stepinfoall,
  unsigned long int      do_block_init )
{
  /*---Declarations---*/
    const int noctant_per_block = sweeper.noctant_per_block;

    const int nsemiblock = sweeper.nsemiblock;

    int semiblock_step = 0;

    /*=========================================================================
    =    OpenMP-parallelizing octants leads to the problem that for the same
    =    step, two octants may be updating the same location in a state vector.
    =
    =    One solution is to make the state vector update atomic, which is
    =    likely to be inefficient depending on the system.
    =
    =    The alternative used here is to break the step into sub steps
    =    and break the block into subregions such that during a sub-step,
    =    different octants in different threads update disjoint subregions.
    =
    =    First, note that octants are assigned to threads as follows:
    =      nthread_octant==1: one thread for all octants.
    =      nthread_octant==2: -x and +x octants assigned to different threads.
    =      nthread_octant==4: -y and +y octants also have different threads.
    =      nthread_octant==8: -z and +z octants also have different threads.
    =
    =    Along each coordinate axis for which two threads are assigned,
    =    the block is divided into two halves.  This gives a set of semiblocks.
    =
    =    The semiblocks are visited by the semiblock loop in an ordering
    =    which is lexicographical, either forward or reverse direction
    =    depending on the direction specified by that octant along the axis.
    =    This is set up so that (1) the disjointness condition described
    =    above holds, and (2) the cells are visited in an order that
    =    satisfies the sweep recursion.
    =
    =    NOTES:
    =    - For the unthreaded case, nsemiblock and noctant_per_block
    =      can be set to any of the allowed values and the algorithm will
    =      work properly.
    =    - If nsemiblock==noctant_per_block, then any value of nthread_octant
    =      applied to the OpenMP loop will work ok.
    =    - If nsemiblock<noctant_per_block==nthread_octant, then
    =      a potential race condition will occur.  This can be fixed by
    =      making the update of vo at the end of Sweeper_sweep_semiblock atomic.
    =      What is in question here is the overhead of the semiblock loop.
    =      One might want to reduce the number of semiblocks while keeping
    =      noctant_per_block==nthread_octant high to get more thread
    =      parallelism but possibly not too high so as to control the
    =      wavefront latency.
    =========================================================================*/

    /*--------------------*/
    /*---Loop over semiblock steps---*/
    /*--------------------*/

    for( semiblock_step=0; semiblock_step<nsemiblock; ++semiblock_step )
    {
#ifdef USE_OPENMP_TASKS
      /*--------------------*/
      /*---Enter parallel region where tasks will be launched---*/
      /*--------------------*/

      int thread_octant = 0;
      int thread_e = 0;

#pragma omp parallel for firstprivate(sweeper) collapse(2)
      for( thread_octant=0; thread_octant<sweeper.nthread_octant;
                                                             ++thread_octant)
      {
      for( thread_e=0; thread_e<sweeper.nthread_e; ++thread_e)
      {
        sweeper.thread_octant = thread_octant;
        sweeper.thread_e = thread_e;

      /*--------------------*/
      /*---Loop over the space of all tasks to be launched---*/
      /*--------------------*/

      /*---Here we assign one thread/task per subblock---*/

      int thread_z = 0;
      for( thread_z=0; thread_z<sweeper.nthread_z; ++thread_z)
      {
        sweeper.thread_z = thread_z;

      int thread_y = 0;
      for( thread_y=0; thread_y<sweeper.nthread_y; ++thread_y)
      {
        sweeper.thread_y = thread_y;

      int thread_x = 0;
      for( thread_x=0; thread_x<sweeper.nthread_x; ++thread_x)
      {
        sweeper.thread_x = thread_x;

      /*--------------------*/
      /*---Determine dependencies---*/
      /*--------------------*/

      const char* __restrict__ dep_in_x = Sweeper_task_dependency( &sweeper,
                thread_x-1, thread_y,   thread_z,   thread_e, thread_octant );

      const char* __restrict__ dep_in_y = Sweeper_task_dependency( &sweeper,
                thread_x,   thread_y-1, thread_z,   thread_e, thread_octant );

      const char* __restrict__ dep_in_z = Sweeper_task_dependency( &sweeper,
                thread_x,   thread_y,   thread_z-1, thread_e, thread_octant );

      const char* __restrict__ dep_out = Sweeper_task_dependency( &sweeper,
                thread_x,   thread_y,   thread_z,   thread_e, thread_octant );

      /*
        printf("%i %i "
               "Submitting task %i %i %i %i %i  thread %i numthreads %i\n",
               step, semiblock_step,
               thread_x, thread_y, thread_z, thread_e, thread_octant,
               omp_get_thread_num(), omp_get_num_threads());
      */

      /*--------------------*/
      /*---Launch this task---*/
      /*--------------------*/

#pragma omp task \
      depend(in:  dep_in_x[0]) \
      depend(in:  dep_in_y[0]) \
      depend(in:  dep_in_z[0]) \
      depend(out: dep_out[0])
      {
      /*
        printf("%i %i                   "
               "Commencing task %i %i %i %i %i  thread %i\n",
               step, semiblock_step,
               thread_x, thread_y, thread_z, thread_e, thread_octant,
               omp_get_thread_num());
      */
#endif

      /*--------------------*/
      /*---Loop over octants in octant block---*/
      /*---That is, octants that are computed for this semiblock step---*/
      /*--------------------*/

        const int octant_in_block_min =
                             (   sweeper.noctant_per_block *
                               ( Sweeper_thread_octant( &sweeper )     ) )
                           /     sweeper.nthread_octant;
        const int octant_in_block_max =
                             (   sweeper.noctant_per_block *
                               ( Sweeper_thread_octant( &sweeper ) + 1 ) )
                           /     sweeper.nthread_octant;

        int octant_in_block = 0;

      for( octant_in_block=octant_in_block_min;
           octant_in_block<octant_in_block_max; ++octant_in_block )
      {
        /*---Get step info---*/

        const StepInfo stepinfo = stepinfoall.stepinfo[octant_in_block];

        const Bool_t is_octant_active = stepinfo.is_active;

        const int dir_x = Dir_x( stepinfo.octant );
        const int dir_y = Dir_y( stepinfo.octant );
        const int dir_z = Dir_z( stepinfo.octant );

        /*--------------------*/
        /*---Compute semiblock bounds---*/
        /*--------------------*/

        Bool_t is_semiblock_min_x = 0, is_semiblock_max_x = 0;
        int ixmin_semiblock = 0, ixmax_semiblock = 0, ixmax_semiblock_up2 = 0;

        Sweeper_get_semiblock_bounds(&is_semiblock_min_x, &is_semiblock_max_x,
          &ixmin_semiblock, &ixmax_semiblock, &ixmax_semiblock_up2,
          sweeper.dims_b.ncell_x, DIM_X, dir_x, semiblock_step, nsemiblock);

        /*--------------------*/

        Bool_t is_semiblock_min_y = 0, is_semiblock_max_y = 0;
        int iymin_semiblock = 0, iymax_semiblock = 0, iymax_semiblock_up2 = 0;

        Sweeper_get_semiblock_bounds(&is_semiblock_min_y, &is_semiblock_max_y,
          &iymin_semiblock, &iymax_semiblock, &iymax_semiblock_up2,
          sweeper.dims_b.ncell_y, DIM_Y, dir_y, semiblock_step, nsemiblock);

        /*--------------------*/

        Bool_t is_semiblock_min_z = 0, is_semiblock_max_z = 0;
        int izmin_semiblock = 0, izmax_semiblock = 0, izmax_semiblock_up2 = 0;

        Sweeper_get_semiblock_bounds(&is_semiblock_min_z, &is_semiblock_max_z,
          &izmin_semiblock, &izmax_semiblock, &izmax_semiblock_up2,
          sweeper.dims_b.ncell_z, DIM_Z, dir_z, semiblock_step, nsemiblock);

        /*--------------------*/
        /*---Perform sweep over subblocks in semiblock---*/
        /*---(for tasking case, this task sweeps one subblock in semiblock---*/
        /*--------------------*/

        const int iz_base = stepinfo.block_z * sweeper.dims_b.ncell_z;

        const P* vi_this = const_ref_state( vi, sweeper.dims, NU, 0, 0,
                                                            iz_base, 0, 0, 0 );
        P* vo_this =             ref_state( vo, sweeper.dims, NU, 0, 0,
                                                            iz_base, 0, 0, 0 );

        const int do_block_init_this = !! ( do_block_init &
                         ( ((unsigned long int)1) <<
                           ( octant_in_block + noctant_per_block *
                             semiblock_step ) ) );

        Sweeper_sweep_semiblock( &sweeper, vo_this, vi_this,
                                 facexy, facexz, faceyz,
                                 a_from_m, m_from_a,
                                 &quan, stepinfo, octant_in_block,
                                 ixmin_semiblock, ixmax_semiblock_up2,
                                 iymin_semiblock, iymax_semiblock_up2,
                                 izmin_semiblock, izmax_semiblock_up2,
                                 do_block_init_this,
                                 is_octant_active );

      } /*---octant_in_block---*/

#ifdef USE_OPENMP_TASKS
      /*
        printf("%i %i                                                 "
               "Completing task %i %i %i %i %i  thread %i\n",
               step, semiblock_step,
               thread_x, thread_y, thread_z, thread_e, thread_octant,
               omp_get_thread_num());
      */

      } /*---omp task---*/
      }
      }
      }
      }
      } /*---omp parallel for---*/ /*---NOTE: implicit sync here---*/
#else
      /*---Sync between semiblock steps---*/
      Sweeper_sync_octant_threads( &sweeper );
#endif

    } /*---semiblock---*/
}